

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void lua_settop(lua_State *L,int idx)

{
  StkId pTVar1;
  StkId pTVar2;
  
  if (idx < 0) {
    pTVar1 = L->top + (long)idx + 1;
  }
  else {
    pTVar1 = L->base + (uint)idx;
    pTVar2 = L->top;
    while (pTVar2 < pTVar1) {
      L->top = pTVar2 + 1;
      pTVar2->tt = 0;
      pTVar2 = pTVar2 + 1;
    }
  }
  L->top = pTVar1;
  return;
}

Assistant:

static void lua_settop(lua_State*L,int idx){
if(idx>=0){
luai_apicheck(L,idx<=L->stack_last-L->base);
while(L->top<L->base+idx)
setnilvalue(L->top++);
L->top=L->base+idx;
}
else{
luai_apicheck(L,-(idx+1)<=(L->top-L->base));
L->top+=idx+1;
}
}